

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

CPAccessResult aa64_zva_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  ulong uVar1;
  uint64_t uVar2;
  uint uVar3;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 != 0) {
      uVar3 = env->pstate >> 2 & 3;
      if (1 < uVar3) {
        return CP_ACCESS_OK;
      }
      goto LAB_0061aa63;
    }
    uVar3 = env->uncached_cpsr & 0x1f;
    if (uVar3 == 0x1a) {
      return CP_ACCESS_OK;
    }
    if (uVar3 == 0x16) {
      return CP_ACCESS_OK;
    }
    if (uVar3 != 0x10) {
      if ((uVar1 >> 0x21 & 1) != 0) {
        if (uVar3 == 0x16) {
          if (((uint)uVar1 >> 0x1c & 1) == 0) {
            return CP_ACCESS_OK;
          }
        }
        else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) {
          return CP_ACCESS_OK;
        }
      }
      goto LAB_0061aa1d;
    }
    uVar2 = arm_hcr_el2_eff_aarch64(env);
  }
  else {
    if ((env->v7m).exception != 0) {
LAB_0061aa1d:
      uVar2 = arm_hcr_el2_eff_aarch64(env);
      goto LAB_0061aa72;
    }
    uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
LAB_0061aa63:
    uVar2 = arm_hcr_el2_eff_aarch64(env);
    if (uVar3 != 0) goto LAB_0061aa72;
  }
  if ((~uVar2 & 0x408000000) == 0) {
    if ((*(byte *)((long)&(env->cp15).field_2 + 0x11) & 0x40) != 0) {
      return CP_ACCESS_OK;
    }
    return CP_ACCESS_TRAP_EL2;
  }
  if ((undefined1  [32])((undefined1  [32])(env->cp15).field_2 & (undefined1  [32])0x4000) ==
      (undefined1  [32])0x0) {
    return CP_ACCESS_TRAP;
  }
LAB_0061aa72:
  if (((uint)uVar2 >> 0x1c & 1) == 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_EL2;
}

Assistant:

static CPAccessResult aa64_zva_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                      bool isread)
{
    int cur_el = arm_current_el(env);

    if (cur_el < 2) {
        uint64_t hcr = arm_hcr_el2_eff(env);

        if (cur_el == 0) {
            if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
                if (!(env->cp15.sctlr_el[2] & SCTLR_DZE)) {
                    return CP_ACCESS_TRAP_EL2;
                }
            } else {
                if (!(env->cp15.sctlr_el[1] & SCTLR_DZE)) {
                    return CP_ACCESS_TRAP;
                }
                if (hcr & HCR_TDZ) {
                    return CP_ACCESS_TRAP_EL2;
                }
            }
        } else if (hcr & HCR_TDZ) {
            return CP_ACCESS_TRAP_EL2;
        }
    }
    return CP_ACCESS_OK;
}